

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O2

istream * operator>>(istream *is,Plane *item)

{
  int iVar1;
  istream *piVar2;
  istream *piVar3;
  string tmpcate;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  string local_30;
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  piVar2 = std::operator>>(is,(string *)item);
  piVar2 = std::operator>>(piVar2,(string *)&local_50);
  piVar3 = (istream *)std::istream::operator>>((istream *)piVar2,&item->airSupremacy);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&item->torpedoAtk);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&item->bombAtk);
  std::istream::operator>>(piVar3,&item->accuracy);
  std::__cxx11::string::string((string *)&local_30,(string *)&local_50);
  iVar1 = PLANE_CATE_convert(&local_30);
  item->category = iVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return is;
}

Assistant:

istream &operator>>(istream &is,Plane &item){
    string tmpcate;
    is>>item.name>>tmpcate>>item.airSupremacy>>item.torpedoAtk>>item.bombAtk>>item.accuracy;
    item.category=PLANE_CATE_convert(tmpcate);
    return is;
}